

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baillie_bench.cpp
# Opt level: O0

void BM_rabinMiller(State *state)

{
  unsigned_long *puVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  const_reference pvVar4;
  bool bVar5;
  State *local_158;
  allocator<char> local_131;
  key_type local_130;
  double local_110;
  undefined8 local_108;
  undefined1 local_f9;
  undefined4 local_f8;
  bool res;
  int k;
  Value _;
  StateIterator __end1;
  StateIterator __begin1;
  State *__range1;
  State *state_local;
  undefined1 local_b8 [16];
  State *local_a8;
  undefined1 local_a0 [16];
  int *local_90;
  State **local_88;
  bool local_79;
  State **local_78;
  ulong local_70;
  State *local_68;
  ulong local_60;
  State *local_58;
  undefined4 local_50;
  undefined4 local_4c;
  double local_48;
  double *local_40;
  State **local_38;
  State *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  
  local_18 = local_b8;
  if (((byte)state[0x1a] & 1) == 0) {
    local_158 = *(State **)(state + 0x10);
  }
  else {
    local_158 = (State *)0x0;
  }
  __end1.parent_ = local_158;
  local_a8 = state;
  local_20 = state;
  benchmark::State::StartKeepRunning(state);
  local_10 = local_a0;
  _k = 0;
  __end1.cached_ = 0;
  while( true ) {
    local_88 = &__end1.parent_;
    local_90 = &k;
    bVar5 = __end1.parent_ == (State *)0x0;
    if (bVar5) {
      benchmark::State::FinishKeepRunning(state);
    }
    local_79 = !bVar5;
    if (!local_79) {
      local_70 = 0;
      local_68 = state;
      sVar3 = std::vector<long,_std::allocator<long>_>::size
                        ((vector<long,_std::allocator<long>_> *)(state + 0x20));
      if (local_70 < sVar3) {
        pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)(state + 0x20),local_70);
        *(value_type *)(state + 0x38) = *pvVar4;
        return;
      }
      __assert_fail("range_.size() > pos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bitwyre[P]baillie_psw/benchmark.h"
                    ,0x272,"int64_t benchmark::State::range(std::size_t) const");
    }
    local_78 = &__end1.parent_;
    local_f8 = 4;
    local_60 = 0;
    local_58 = state;
    sVar3 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)(state + 0x20));
    if (sVar3 <= local_60) {
      __assert_fail("range_.size() > pos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bitwyre[P]baillie_psw/benchmark.h"
                    ,0x272,"int64_t benchmark::State::range(std::size_t) const");
    }
    puVar1 = (unsigned_long *)
             std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)(state + 0x20),local_60);
    local_f9 = baillieTest(*puVar1);
    local_110 = (double)(byte)local_f9;
    local_40 = &local_110;
    local_4c = 0;
    local_50 = 1000;
    local_108._0_4_ = 0;
    local_108._4_4_ = 1000;
    local_48 = local_110;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"IS PRIME",&local_131);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
                           *)(state + 0x40),&local_130);
    pmVar2->value = local_110;
    pmVar2->flags = (undefined4)local_108;
    pmVar2->oneK = local_108._4_4_;
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    local_38 = &__end1.parent_;
    if (__end1.parent_ == (State *)0x0) break;
    __end1.parent_ = __end1.parent_ + -1;
  }
  __assert_fail("cached_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bitwyre[P]baillie_psw/benchmark.h"
                ,0x2ef,"StateIterator &benchmark::State::StateIterator::operator++()");
}

Assistant:

static void BM_rabinMiller(benchmark::State& state) {

  for (auto _ : state) {
      int k = 4;
      auto res = baillieTest(state.range(0));
      state.counters["IS PRIME"] = res; 
  }
  state.SetComplexityN(state.range(0));
}